

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint _h;
  uint _w;
  Mat *this_00;
  Mat *this_01;
  size_t sVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  void *pvVar10;
  int y;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  void *pvVar18;
  ulong uVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  float *rows1_old;
  int iVar28;
  int iVar29;
  void *pvVar30;
  void *pvVar31;
  void *pvVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  float *pfVar36;
  long lVar37;
  int iVar38;
  undefined4 *puVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  float *rows2_old;
  float fVar44;
  float fVar45;
  float *local_250;
  void *local_248;
  Mat top_blob_c;
  Mat dst;
  Mat src;
  Mat dst_1;
  Mat rowsbuf1;
  Mat src_1;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = this_00->w;
  _h = this_00->h;
  uVar35 = (ulong)_h;
  sVar6 = this_00->elemsize;
  _w = this_00[1].w;
  lVar37 = (long)(int)_w;
  if (this_00->dims == 2) {
    if (_w == uVar5) goto LAB_00272d6a;
    Mat::create(this_01,_w,_h,sVar6,opt->blob_allocator);
    pvVar21 = this_01->data;
    if (pvVar21 == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep == 0) {
      return -100;
    }
    iVar11 = this->resize_type;
    if (iVar11 == 2) {
      uVar42 = lVar37 * 0xc;
      if ((int)_w < 0) {
        uVar42 = 0xffffffffffffffff;
      }
      piVar17 = (int *)operator_new__(uVar42);
      linear_coeffs(uVar5,_w,piVar17,(float *)(piVar17 + lVar37),this->align_corner);
      uVar42 = 0;
      uVar19 = 0;
      if (0 < (int)_w) {
        uVar19 = (ulong)_w;
      }
      uVar24 = 0;
      if (0 < (int)_h) {
        uVar24 = uVar35;
      }
      for (; uVar42 != uVar24; uVar42 = uVar42 + 1) {
        iVar11 = this_00->w;
        sVar6 = this_00->elemsize;
        pvVar31 = this_00->data;
        iVar38 = this_01->w;
        sVar7 = this_01->elemsize;
        for (uVar34 = 0; uVar19 != uVar34; uVar34 = uVar34 + 1) {
          uVar4 = *(undefined8 *)(piVar17 + lVar37 + uVar34 * 2);
          uVar3 = *(undefined8 *)
                   ((long)pvVar31 + (long)piVar17[uVar34] * 4 + (long)iVar11 * uVar42 * sVar6);
          *(float *)((long)pvVar21 + uVar34 * 4 + sVar7 * uVar42 * (long)iVar38) =
               (float)((ulong)uVar3 >> 0x20) * (float)((ulong)uVar4 >> 0x20) +
               (float)uVar3 * (float)uVar4;
        }
      }
      operator_delete__(piVar17);
      iVar11 = this->resize_type;
    }
    else if (iVar11 == 1) {
      if (_w == 0) {
        fVar44 = 1.0 / this->width_scale;
      }
      else {
        fVar44 = (float)(int)uVar5 / (float)(int)_w;
      }
      uVar13 = 0;
      if (0 < (int)_w) {
        uVar13 = _w;
      }
      if ((int)_h < 1) {
        uVar35 = 0;
      }
      for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
        iVar11 = this_00->w;
        sVar6 = this_00->elemsize;
        pvVar31 = this_00->data;
        iVar38 = this_01->w;
        sVar7 = this_01->elemsize;
        for (lVar37 = 0; uVar13 != (uint)lVar37; lVar37 = lVar37 + 1) {
          iVar33 = (int)((float)(int)(uint)lVar37 * fVar44);
          iVar28 = uVar5 - 1;
          if (iVar33 <= (int)(uVar5 - 1)) {
            iVar28 = iVar33;
          }
          *(undefined4 *)((long)pvVar21 + lVar37 * 4 + sVar7 * uVar42 * (long)iVar38) =
               *(undefined4 *)((long)pvVar31 + (long)iVar28 * 4 + (long)iVar11 * uVar42 * sVar6);
        }
      }
      return 0;
    }
    if (iVar11 != 3) {
      return 0;
    }
    uVar42 = lVar37 * 0x14;
    if ((int)_w < 0) {
      uVar42 = 0xffffffffffffffff;
    }
    piVar17 = (int *)operator_new__(uVar42);
    cubic_coeffs(uVar5,_w,piVar17,(float *)(piVar17 + lVar37),this->align_corner);
    uVar42 = 0;
    uVar19 = 0;
    if (0 < (int)_w) {
      uVar19 = (ulong)_w;
    }
    if ((int)_h < 1) {
      uVar35 = uVar42;
    }
    for (; uVar42 != uVar35; uVar42 = uVar42 + 1) {
      pvVar21 = this_00->data;
      iVar11 = this_00->w;
      sVar6 = this_00->elemsize;
      iVar38 = this_01->w;
      sVar7 = this_01->elemsize;
      pvVar31 = this_01->data;
      for (lVar41 = 0; uVar19 * 4 != lVar41; lVar41 = lVar41 + 4) {
        pfVar1 = (float *)(piVar17 + lVar37 + lVar41);
        pfVar36 = (float *)((long)pvVar21 +
                           (long)*(int *)((long)piVar17 + lVar41) * 4 +
                           (long)iVar11 * uVar42 * sVar6 + -4);
        *(float *)((long)pvVar31 + lVar41 + sVar7 * uVar42 * (long)iVar38) =
             pfVar36[3] * pfVar1[3] + pfVar36[1] * pfVar1[1] +
             pfVar36[2] * pfVar1[2] + *pfVar36 * *pfVar1;
      }
    }
  }
  else {
    uVar13 = this_00[1].h;
    lVar41 = (long)(int)uVar13;
    if (this_00->dims == 1) {
      Mat::create(this_01,_w,uVar13,uVar5,sVar6,opt->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep != 0) {
        uVar35 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar35 = 0;
        }
        for (uVar42 = 0; uVar35 != uVar42; uVar42 = uVar42 + 1) {
          Mat::channel(&top_blob_c,this_01,(int)uVar42);
          Mat::fill(&top_blob_c,*(float *)((long)this_00->data + uVar42 * 4));
          Mat::~Mat(&top_blob_c);
        }
        return 0;
      }
      return -100;
    }
    if (uVar13 == _h && _w == uVar5) {
LAB_00272d6a:
      Mat::operator=(this_01,this_00);
      return 0;
    }
    iVar11 = this_00->c;
    Mat::create(this_01,_w,uVar13,iVar11,sVar6,opt->blob_allocator);
    if (this_01->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_01->c * this_01->cstep == 0) {
      return -100;
    }
    iVar38 = this->resize_type;
    if (iVar38 == 1) {
      if (uVar13 == 0) {
        fVar44 = 1.0 / this->height_scale;
      }
      else {
        fVar44 = (float)(int)_h / (float)(int)uVar13;
      }
      if (_w == 0) {
        fVar45 = 1.0 / this->width_scale;
      }
      else {
        fVar45 = (float)(int)uVar5 / (float)(int)_w;
      }
      iVar38 = 0;
      uVar40 = 0;
      if (0 < (int)_w) {
        uVar40 = _w;
      }
      uVar43 = 0;
      if (0 < (int)uVar13) {
        uVar43 = uVar13;
      }
      iVar28 = 0;
      if (0 < iVar11) {
        iVar28 = iVar11;
      }
      for (; iVar38 != iVar28; iVar38 = iVar38 + 1) {
        Mat::channel(&top_blob_c,this_00,iVar38);
        pvVar21 = top_blob_c.data;
        Mat::~Mat(&top_blob_c);
        Mat::channel(&top_blob_c,this_01,iVar38);
        puVar39 = (undefined4 *)top_blob_c.data;
        Mat::~Mat(&top_blob_c);
        for (uVar12 = 0; uVar12 != uVar43; uVar12 = uVar12 + 1) {
          iVar33 = (int)((float)(int)uVar12 * fVar44);
          if ((int)(_h - 1) < (int)((float)(int)uVar12 * fVar44)) {
            iVar33 = _h - 1;
          }
          for (uVar23 = 0; uVar40 != uVar23; uVar23 = uVar23 + 1) {
            iVar29 = uVar5 - 1;
            if ((int)((float)(int)uVar23 * fVar45) <= (int)(uVar5 - 1)) {
              iVar29 = (int)((float)(int)uVar23 * fVar45);
            }
            *puVar39 = *(undefined4 *)((long)pvVar21 + (long)(int)(iVar29 + iVar33 * uVar5) * 4);
            puVar39 = puVar39 + 1;
          }
        }
      }
      iVar38 = this->resize_type;
    }
    if (iVar38 == 2) {
      iVar38 = _w * 3 + uVar13 + uVar13 * 2;
      uVar35 = (long)iVar38 * 4;
      if (iVar38 < 0) {
        uVar35 = 0xffffffffffffffff;
      }
      piVar14 = (int *)operator_new__(uVar35);
      piVar17 = piVar14 + lVar37;
      pfVar1 = (float *)(piVar17 + lVar41);
      iVar38 = this->align_corner;
      linear_coeffs(uVar5,_w,piVar14,pfVar1,iVar38);
      linear_coeffs(_h,uVar13,piVar17,pfVar1 + lVar37 * 2,iVar38);
      iVar38 = 0;
      if (0 < iVar11) {
        iVar38 = iVar11;
      }
      for (iVar28 = 0; iVar28 != iVar38; iVar28 = iVar28 + 1) {
        Mat::channel(&src,this_00,iVar28);
        Mat::channel(&dst,this_01,iVar28);
        uVar43 = dst.h;
        uVar40 = dst.w;
        Mat::Mat(&top_blob_c,dst.w,4,(Allocator *)0x0);
        Mat::Mat(&rowsbuf1,uVar40,4,(Allocator *)0x0);
        lVar15 = (long)src.w * src.elemsize;
        if ((int)uVar40 < 1) {
          uVar40 = 0;
        }
        if ((int)uVar43 < 1) {
          uVar43 = 0;
        }
        pvVar21 = top_blob_c.data;
        pvVar31 = dst.data;
        pfVar36 = pfVar1 + lVar37 * 2;
        pvVar30 = rowsbuf1.data;
        iVar33 = -2;
        for (uVar35 = 0; uVar35 != uVar43; uVar35 = uVar35 + 1) {
          iVar29 = piVar17[uVar35];
          pvVar20 = pvVar21;
          pvVar18 = pvVar30;
          if (iVar29 != iVar33) {
            lVar16 = (long)iVar29;
            if (iVar29 == iVar33 + 1) {
              for (uVar42 = 0; pvVar20 = pvVar30, pvVar18 = pvVar21, uVar40 != uVar42;
                  uVar42 = uVar42 + 1) {
                uVar4 = *(undefined8 *)
                         ((long)src.data + (long)piVar14[uVar42] * 4 + (lVar16 + 1) * lVar15);
                *(float *)((long)pvVar21 + uVar42 * 4) =
                     (float)((ulong)uVar4 >> 0x20) *
                     (float)((ulong)*(undefined8 *)(piVar14 + lVar37 + lVar41 + uVar42 * 2) >> 0x20)
                     + (float)uVar4 * (float)*(undefined8 *)(piVar14 + lVar37 + lVar41 + uVar42 * 2)
                ;
              }
            }
            else {
              for (uVar42 = 0; uVar40 != uVar42; uVar42 = uVar42 + 1) {
                iVar33 = piVar14[uVar42];
                uVar4 = *(undefined8 *)((long)src.data + (long)iVar33 * 4 + lVar15 * lVar16);
                fVar44 = (float)*(undefined8 *)(piVar14 + lVar37 + lVar41 + uVar42 * 2);
                fVar45 = (float)((ulong)*(undefined8 *)(piVar14 + lVar37 + lVar41 + uVar42 * 2) >>
                                0x20);
                *(float *)((long)pvVar21 + uVar42 * 4) =
                     (float)((ulong)uVar4 >> 0x20) * fVar45 + (float)uVar4 * fVar44;
                uVar4 = *(undefined8 *)((long)src.data + (long)iVar33 * 4 + (lVar16 + 1) * lVar15);
                *(float *)((long)pvVar30 + uVar42 * 4) =
                     (float)((ulong)uVar4 >> 0x20) * fVar45 + (float)uVar4 * fVar44;
              }
            }
          }
          pvVar30 = pvVar18;
          uVar4 = *(undefined8 *)pfVar36;
          for (lVar16 = 0; uVar40 != (uint)lVar16; lVar16 = lVar16 + 1) {
            *(float *)((long)pvVar31 + lVar16 * 4) =
                 *(float *)((long)pvVar30 + lVar16 * 4) * (float)((ulong)uVar4 >> 0x20) +
                 *(float *)((long)pvVar20 + lVar16 * 4) * (float)uVar4;
          }
          pfVar36 = pfVar36 + 2;
          pvVar31 = (void *)((long)pvVar31 + (long)dst.w * dst.elemsize);
          pvVar21 = pvVar20;
          iVar33 = iVar29;
        }
        Mat::~Mat(&rowsbuf1);
        Mat::~Mat(&top_blob_c);
        Mat::~Mat(&dst);
        Mat::~Mat(&src);
      }
      operator_delete__(piVar14);
      iVar38 = this->resize_type;
    }
    if (iVar38 != 3) {
      return 0;
    }
    iVar38 = uVar13 * 5 + _w + _w * 4;
    uVar35 = (long)iVar38 * 4;
    if (iVar38 < 0) {
      uVar35 = 0xffffffffffffffff;
    }
    piVar17 = (int *)operator_new__(uVar35);
    piVar14 = piVar17 + lVar37;
    pfVar1 = (float *)(piVar14 + lVar41);
    cubic_coeffs(uVar5,_w,piVar17,pfVar1,this->align_corner);
    cubic_coeffs(_h,uVar13,piVar14,pfVar1 + (int)(_w * 4),this->align_corner);
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    iVar38 = 0;
    while( true ) {
      if (iVar38 == iVar11) break;
      Mat::channel(&src_1,this_00,iVar38);
      Mat::channel(&dst_1,this_01,iVar38);
      iVar28 = dst_1.h;
      uVar5 = dst_1.w;
      uVar35 = (ulong)(uint)dst_1.h;
      Mat::Mat(&top_blob_c,dst_1.w,4,(Allocator *)0x0);
      Mat::Mat(&rowsbuf1,uVar5,4,(Allocator *)0x0);
      Mat::Mat(&src,uVar5,4,(Allocator *)0x0);
      Mat::Mat(&dst,uVar5,4,(Allocator *)0x0);
      local_248 = dst.data;
      lVar15 = (long)src_1.w * src_1.elemsize;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      if (iVar28 < 1) {
        uVar35 = 0;
      }
      lVar16 = (ulong)uVar5 * 4;
      pvVar21 = top_blob_c.data;
      pvVar31 = rowsbuf1.data;
      pvVar30 = dst_1.data;
      pvVar20 = src.data;
      local_250 = pfVar1 + (int)(_w * 4);
      iVar28 = -3;
      for (uVar42 = 0; uVar42 != uVar35; uVar42 = uVar42 + 1) {
        iVar33 = piVar14[uVar42];
        pvVar18 = local_248;
        pvVar22 = pvVar21;
        pvVar32 = pvVar20;
        pvVar10 = pvVar31;
        if (iVar33 != iVar28) {
          lVar26 = (long)iVar33;
          if (iVar33 == iVar28 + 1) {
            for (lVar25 = 0; pvVar18 = pvVar21, pvVar22 = pvVar31, pvVar32 = local_248,
                pvVar10 = pvVar20, lVar16 - lVar25 != 0; lVar25 = lVar25 + 4) {
              pfVar36 = (float *)(piVar17 + lVar37 + lVar41 + lVar25);
              pfVar2 = (float *)((long)src_1.data +
                                (long)*(int *)((long)piVar17 + lVar25) * 4 +
                                (lVar26 + 2) * lVar15 + -4);
              *(float *)((long)pvVar21 + lVar25) =
                   pfVar2[3] * pfVar36[3] + pfVar2[1] * pfVar36[1] +
                   pfVar2[2] * pfVar36[2] + *pfVar2 * *pfVar36;
            }
          }
          else if (iVar33 == iVar28 + 2) {
            for (lVar25 = 0; pvVar18 = pvVar31, pvVar22 = pvVar20, pvVar32 = pvVar21,
                pvVar10 = local_248, lVar16 - lVar25 != 0; lVar25 = lVar25 + 4) {
              iVar28 = *(int *)((long)piVar17 + lVar25);
              pfVar36 = (float *)(piVar17 + lVar37 + lVar41 + lVar25);
              fVar44 = *pfVar36;
              fVar45 = pfVar36[1];
              fVar8 = pfVar36[2];
              fVar9 = pfVar36[3];
              pfVar36 = (float *)((long)src_1.data + (long)iVar28 * 4 + (lVar26 + 1) * lVar15 + -4);
              *(float *)((long)pvVar21 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
              pfVar36 = (float *)((long)src_1.data + (long)iVar28 * 4 + (lVar26 + 2) * lVar15 + -4);
              *(float *)((long)pvVar31 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
            }
          }
          else if (iVar33 == iVar28 + 3) {
            for (lVar25 = 0; pvVar18 = pvVar20, pvVar22 = local_248, pvVar32 = pvVar31,
                pvVar10 = pvVar21, lVar16 - lVar25 != 0; lVar25 = lVar25 + 4) {
              lVar27 = (long)*(int *)((long)piVar17 + lVar25);
              pfVar36 = (float *)(piVar17 + lVar37 + lVar41 + lVar25);
              fVar44 = *pfVar36;
              fVar45 = pfVar36[1];
              fVar8 = pfVar36[2];
              fVar9 = pfVar36[3];
              pfVar36 = (float *)((long)src_1.data + lVar27 * 4 + lVar15 * lVar26 + -4);
              *(float *)((long)pvVar21 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
              pfVar36 = (float *)((long)src_1.data + lVar27 * 4 + (lVar26 + 1) * lVar15 + -4);
              *(float *)((long)pvVar31 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
              pfVar36 = (float *)((long)src_1.data + lVar27 * 4 + (lVar26 + 2) * lVar15 + -4);
              *(float *)((long)pvVar20 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
            }
          }
          else {
            for (lVar25 = 0; lVar16 - lVar25 != 0; lVar25 = lVar25 + 4) {
              lVar27 = (long)*(int *)((long)piVar17 + lVar25);
              pfVar36 = (float *)(piVar17 + lVar37 + lVar41 + lVar25);
              fVar44 = *pfVar36;
              fVar45 = pfVar36[1];
              fVar8 = pfVar36[2];
              fVar9 = pfVar36[3];
              pfVar36 = (float *)((long)src_1.data + lVar27 * 4 + (lVar26 + -1) * lVar15 + -4);
              *(float *)((long)pvVar21 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
              pfVar36 = (float *)((long)src_1.data + lVar27 * 4 + lVar15 * lVar26 + -4);
              *(float *)((long)pvVar31 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
              pfVar36 = (float *)((long)src_1.data + lVar27 * 4 + (lVar26 + 1) * lVar15 + -4);
              *(float *)((long)pvVar20 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
              pfVar36 = (float *)((long)src_1.data + lVar27 * 4 + (lVar26 + 2) * lVar15 + -4);
              *(float *)((long)local_248 + lVar25) =
                   pfVar36[3] * fVar9 + pfVar36[1] * fVar45 + pfVar36[2] * fVar8 + *pfVar36 * fVar44
              ;
            }
          }
        }
        pvVar31 = pvVar10;
        fVar44 = *local_250;
        fVar45 = local_250[1];
        fVar8 = local_250[2];
        fVar9 = local_250[3];
        for (lVar26 = 0; uVar5 != (uint)lVar26; lVar26 = lVar26 + 1) {
          *(float *)((long)pvVar30 + lVar26 * 4) =
               *(float *)((long)pvVar18 + lVar26 * 4) * fVar9 +
               *(float *)((long)pvVar31 + lVar26 * 4) * fVar45 +
               *(float *)((long)pvVar32 + lVar26 * 4) * fVar8 +
               *(float *)((long)pvVar22 + lVar26 * 4) * fVar44;
        }
        local_250 = local_250 + 4;
        pvVar30 = (void *)((long)pvVar30 + (long)dst_1.w * dst_1.elemsize);
        pvVar21 = pvVar22;
        pvVar20 = pvVar32;
        local_248 = pvVar18;
        iVar28 = iVar33;
      }
      Mat::~Mat(&dst);
      Mat::~Mat(&src);
      Mat::~Mat(&rowsbuf1);
      Mat::~Mat(&top_blob_c);
      Mat::~Mat(&dst_1);
      Mat::~Mat(&src_1);
      iVar38 = iVar38 + 1;
    }
  }
  operator_delete__(piVar17);
  return 0;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = outw ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = outh ? h / (float)outh : 1.f / height_scale;
        const float ws = outw ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}